

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCec.c
# Opt level: O2

int Cec_ManHandleSpecialCases(Gia_Man_t *p,Cec_ParCec_t *pPars)

{
  int *piVar1;
  Abc_Cex_t *pAVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pGVar7;
  abctime time;
  abctime time_00;
  abctime time_01;
  abctime time_02;
  uint uVar8;
  char *pcVar9;
  int iVar10;
  Gia_Man_t *pGVar11;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pObj_00;
  int iVar12;
  
  aVar5 = Abc_Clock();
  pGVar11 = p;
  Gia_ManSetPhase(p);
  uVar8 = 0;
  iVar12 = 0;
  do {
    iVar10 = (int)pGVar11;
    iVar4 = p->vCos->nSize;
    iVar3 = (int)aVar5;
    if (iVar4 - p->nRegs <= iVar12) {
LAB_00515700:
      if (p->nObjs == iVar4 + p->vCis->nSize + 1) {
        iVar12 = 1;
        if (pPars->fSilent == 0) {
          pcVar9 = "Networks are equivalent.  ";
          Abc_Print(iVar10,"Networks are equivalent.  ");
          aVar5 = Abc_Clock();
          Abc_PrintTime((int)aVar5 - iVar3,pcVar9,time_00);
        }
      }
      else {
        iVar12 = -1;
      }
      return iVar12;
    }
    pGVar11 = p;
    pGVar6 = Gia_ManCo(p,iVar12);
    iVar10 = (int)pGVar11;
    if (pGVar6 == (Gia_Obj_t *)0x0) {
      iVar4 = p->vCos->nSize;
      goto LAB_00515700;
    }
    pGVar11 = p;
    pGVar7 = Gia_ManPo(p,iVar12 + 1);
    if ((long)(*(ulong *)pGVar7 ^ *(ulong *)pGVar6) < 0) {
      if (pPars->fSilent == 0) {
        pcVar9 = "Networks are NOT EQUIVALENT. Output %d trivially differs (different phase).  ";
        Abc_Print((int)pGVar11,
                  "Networks are NOT EQUIVALENT. Output %d trivially differs (different phase).  ",
                  (ulong)uVar8);
        aVar5 = Abc_Clock();
        Abc_PrintTime((int)aVar5 - iVar3,pcVar9,time_01);
      }
      pPars->iOutFail = uVar8;
      Cec_ManTransformPattern(p,uVar8,(int *)0x0);
      return 0;
    }
    pObj_00 = pGVar6 + -(*(ulong *)pGVar6 & 0x1fffffff);
    pObj = pGVar7 + -(*(ulong *)pGVar7 & 0x1fffffff);
    iVar4 = Gia_ObjIsPi(p,pObj_00);
    if ((iVar4 != 0) && (pGVar11 = p, iVar4 = Gia_ObjIsPi(p,pObj), pObj_00 != pObj && iVar4 != 0)) {
      if (pPars->fSilent == 0) {
        pcVar9 = "Networks are NOT EQUIVALENT. Output %d trivially differs (different PIs).  ";
        Abc_Print((int)pGVar11,
                  "Networks are NOT EQUIVALENT. Output %d trivially differs (different PIs).  ",
                  (ulong)uVar8);
        aVar5 = Abc_Clock();
        Abc_PrintTime((int)aVar5 - iVar3,pcVar9,time_02);
      }
      pPars->iOutFail = uVar8;
      Cec_ManTransformPattern(p,uVar8,(int *)0x0);
      if (((*(uint *)pGVar7 ^ *(uint *)pGVar6) >> 0x1d & 1) == 0) {
        pAVar2 = p->pCexComb;
        uVar8 = Gia_ObjCioId(pObj_00);
        piVar1 = &pAVar2[1].iPo + (uVar8 >> 5);
        *piVar1 = *piVar1 | 1 << ((byte)uVar8 & 0x1f);
        return 0;
      }
      __assert_fail("Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCec.c"
                    ,0xb3,"int Cec_ManHandleSpecialCases(Gia_Man_t *, Cec_ParCec_t *)");
    }
    pGVar11 = p;
    iVar4 = Gia_ObjIsPi(p,pObj_00);
    iVar10 = (int)pGVar11;
    if ((iVar4 != 0) && ((~*(ulong *)pObj & 0x1fffffff1fffffff) == 0)) {
LAB_00515684:
      if (pPars->fSilent == 0) {
        pcVar9 = "Networks are NOT EQUIVALENT. Output %d trivially differs (PI vs. constant).  ";
        Abc_Print(iVar10,
                  "Networks are NOT EQUIVALENT. Output %d trivially differs (PI vs. constant).  ",
                  (ulong)uVar8);
        aVar5 = Abc_Clock();
        Abc_PrintTime((int)aVar5 - iVar3,pcVar9,time);
      }
      pPars->iOutFail = uVar8;
      Cec_ManTransformPattern(p,uVar8,(int *)0x0);
      if (((*(uint *)pGVar7 ^ *(uint *)pGVar6) >> 0x1d & 1) == 0) {
        iVar12 = Gia_ObjIsPi(p,pObj_00);
        pAVar2 = p->pCexComb;
        if (iVar12 != 0) {
          pObj = pObj_00;
        }
        uVar8 = Gia_ObjCioId(pObj);
        piVar1 = &pAVar2[1].iPo + (uVar8 >> 5);
        *piVar1 = *piVar1 | 1 << ((byte)uVar8 & 0x1f);
        return 0;
      }
      __assert_fail("Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecCec.c"
                    ,0xc3,"int Cec_ManHandleSpecialCases(Gia_Man_t *, Cec_ParCec_t *)");
    }
    pGVar11 = p;
    iVar4 = Gia_ObjIsPi(p,pObj);
    iVar10 = (int)pGVar11;
    if ((iVar4 != 0) && ((~*(ulong *)pObj_00 & 0x1fffffff1fffffff) == 0)) goto LAB_00515684;
    uVar8 = uVar8 + 1;
    iVar12 = iVar12 + 2;
  } while( true );
}

Assistant:

int Cec_ManHandleSpecialCases( Gia_Man_t * p, Cec_ParCec_t * pPars )
{
    Gia_Obj_t * pObj1, * pObj2;
    Gia_Obj_t * pDri1, * pDri2;
    int i;
    abctime clk = Abc_Clock();
    Gia_ManSetPhase( p );
    Gia_ManForEachPo( p, pObj1, i )
    {
        pObj2 = Gia_ManPo( p, ++i );
        // check if they different on all-0 pattern
        // (for example, when they have the same driver but complemented)
        if ( Gia_ObjPhase(pObj1) != Gia_ObjPhase(pObj2) )
        {
            if ( !pPars->fSilent )
            {
            Abc_Print( 1, "Networks are NOT EQUIVALENT. Output %d trivially differs (different phase).  ", i/2 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            pPars->iOutFail = i/2;
            Cec_ManTransformPattern( p, i/2, NULL );
            return 0;
        }
        // get the drivers
        pDri1 = Gia_ObjFanin0(pObj1);
        pDri2 = Gia_ObjFanin0(pObj2);
        // drivers are different PIs
        if ( Gia_ObjIsPi(p, pDri1) && Gia_ObjIsPi(p, pDri2) && pDri1 != pDri2 )
        {
            if ( !pPars->fSilent )
            {
            Abc_Print( 1, "Networks are NOT EQUIVALENT. Output %d trivially differs (different PIs).  ", i/2 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            pPars->iOutFail = i/2;
            Cec_ManTransformPattern( p, i/2, NULL );
            // if their compl attributes are the same - one should be complemented
            assert( Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2) );
            Abc_InfoSetBit( p->pCexComb->pData, Gia_ObjCioId(pDri1) );
            return 0;
        }
        // one of the drivers is a PI; another is a constant 0
        if ( (Gia_ObjIsPi(p, pDri1) && Gia_ObjIsConst0(pDri2)) || 
             (Gia_ObjIsPi(p, pDri2) && Gia_ObjIsConst0(pDri1)) )
        {
            if ( !pPars->fSilent )
            {
            Abc_Print( 1, "Networks are NOT EQUIVALENT. Output %d trivially differs (PI vs. constant).  ", i/2 );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            pPars->iOutFail = i/2;
            Cec_ManTransformPattern( p, i/2, NULL );
            // the compl attributes are the same - the PI should be complemented
            assert( Gia_ObjFaninC0(pObj1) == Gia_ObjFaninC0(pObj2) );
            if ( Gia_ObjIsPi(p, pDri1) )
                Abc_InfoSetBit( p->pCexComb->pData, Gia_ObjCioId(pDri1) );
            else
                Abc_InfoSetBit( p->pCexComb->pData, Gia_ObjCioId(pDri2) );
            return 0;
        }
    }
    if ( Gia_ManAndNum(p) == 0 )
    {
        if ( !pPars->fSilent )
        {
        Abc_Print( 1, "Networks are equivalent.  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        return 1;
    }
    return -1;
}